

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeRecordUnpack(KeyInfo *pKeyInfo,int nKey,void *pKey,UnpackedRecord *p)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  u16 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Mem *pMem;
  uint uVar8;
  uint local_4c;
  UnpackedRecord *local_48;
  KeyInfo *local_40;
  uint local_34;
  
  pMem = p->aMem;
  p->default_rc = '\0';
  local_48 = p;
  local_40 = pKeyInfo;
  if (*pKey < '\0') {
    bVar2 = sqlite3GetVarint32((uchar *)pKey,&local_34);
    uVar5 = (uint)bVar2;
    uVar3 = local_34;
  }
  else {
    uVar5 = 1;
    uVar3 = (int)*pKey;
  }
  uVar4 = 0;
  uVar6 = uVar3;
  do {
    if ((uVar3 <= uVar5) || ((uint)nKey < uVar6)) break;
    cVar1 = *(char *)((long)pKey + (ulong)uVar5);
    if (cVar1 < '\0') {
      bVar2 = sqlite3GetVarint32((uchar *)((ulong)uVar5 + (long)pKey),&local_4c);
      uVar8 = (uint)bVar2;
      uVar7 = local_4c;
    }
    else {
      uVar8 = 1;
      uVar7 = (int)cVar1;
    }
    pMem->enc = local_40->enc;
    pMem->db = local_40->db;
    pMem->szMalloc = 0;
    pMem->z = (char *)0x0;
    sqlite3VdbeSerialGet((uchar *)((ulong)uVar6 + (long)pKey),uVar7,pMem);
    if (uVar7 < 0x80) {
      uVar7 = (uint)""[uVar7];
    }
    else {
      uVar7 = uVar7 - 0xc >> 1;
    }
    uVar5 = uVar5 + uVar8;
    uVar6 = uVar6 + uVar7;
    pMem = pMem + 1;
    uVar4 = uVar4 + 1;
  } while (uVar4 < local_48->nField);
  if (uVar4 != 0 && (uint)nKey < uVar6) {
    if ((pMem[-1].flags & 0x9000) == 0) {
      pMem[-1].flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem + -1);
    }
  }
  local_48->nField = uVar4;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeRecordUnpack(
  KeyInfo *pKeyInfo,     /* Information about the record format */
  int nKey,              /* Size of the binary record */
  const void *pKey,      /* The binary record */
  UnpackedRecord *p      /* Populate this structure before returning. */
){
  const unsigned char *aKey = (const unsigned char *)pKey;
  u32 d;
  u32 idx;                        /* Offset in aKey[] to read from */
  u16 u;                          /* Unsigned loop counter */
  u32 szHdr;
  Mem *pMem = p->aMem;

  p->default_rc = 0;
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  idx = getVarint32(aKey, szHdr);
  d = szHdr;
  u = 0;
  while( idx<szHdr && d<=(u32)nKey ){
    u32 serial_type;

    idx += getVarint32(&aKey[idx], serial_type);
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    /* pMem->flags = 0; // sqlite3VdbeSerialGet() will set this for us */
    pMem->szMalloc = 0;
    pMem->z = 0;
    sqlite3VdbeSerialGet(&aKey[d], serial_type, pMem);
    d += sqlite3VdbeSerialTypeLen(serial_type);
    pMem++;
    if( (++u)>=p->nField ) break;
  }
  if( d>(u32)nKey && u ){
    assert( CORRUPT_DB );
    /* In a corrupt record entry, the last pMem might have been set up using
    ** uninitialized memory. Overwrite its value with NULL, to prevent
    ** warnings from MSAN. */
    sqlite3VdbeMemSetNull(pMem-1);
  }
  assert( u<=pKeyInfo->nKeyField + 1 );
  p->nField = u;
}